

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O2

size_t decay_npurge_after_interval(arena_decay_t *decay,size_t interval)

{
  ulong uVar1;
  size_t sVar2;
  long lVar3;
  
  uVar1 = 0;
  for (sVar2 = 0; interval != sVar2; sVar2 = sVar2 + 1) {
    uVar1 = uVar1 + h_steps[sVar2] * decay->backlog[sVar2];
  }
  lVar3 = 0;
  for (; interval < 200; interval = interval + 1) {
    uVar1 = uVar1 + (h_steps[interval] - *(long *)((long)h_steps + lVar3)) *
                    decay->backlog[interval];
    lVar3 = lVar3 + 8;
  }
  return uVar1 >> 0x18;
}

Assistant:

static inline size_t
decay_npurge_after_interval(arena_decay_t *decay, size_t interval) {
	size_t i;
	uint64_t sum = 0;
	for (i = 0; i < interval; i++) {
		sum += decay->backlog[i] * h_steps[i];
	}
	for (; i < SMOOTHSTEP_NSTEPS; i++) {
		sum += decay->backlog[i] * (h_steps[i] - h_steps[i - interval]);
	}

	return (size_t)(sum >> SMOOTHSTEP_BFP);
}